

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

double __thiscall
ProbabEstimator::getMaxProbab
          (ProbabEstimator *this,double *vecMaxs,int numReplaced,int minPathLength,int maxPathLength
          ,int pathLengthStep)

{
  int in_ECX;
  int in_R8D;
  int in_R9D;
  double probabF;
  int pathLength;
  double maxProbab;
  ProbabEstimator *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  ProbabEstimator *this_00;
  
  this_00 = (ProbabEstimator *)0x0;
  for (; in_ECX <= in_R8D; in_ECX = in_R9D + in_ECX) {
    in_stack_ffffffffffffffc8 =
         (ProbabEstimator *)
         getProbabFast(this_00,(double *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),
                       (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8);
    if ((double)this_00 < (double)in_stack_ffffffffffffffc8) {
      this_00 = in_stack_ffffffffffffffc8;
    }
  }
  return (double)this_00;
}

Assistant:

double ProbabEstimator::getMaxProbab( const double *vecMaxs, const int numReplaced, const int minPathLength, const int maxPathLength, const int pathLengthStep ){
    double maxProbab = 0.0;
    for ( int pathLength = minPathLength; pathLength <= maxPathLength; pathLength += pathLengthStep ){
        double probabF = getProbabFast( vecMaxs, numReplaced, pathLength );
        #ifdef CHECK_FAST_PROBABS
        double probabS = getProbab( vecMaxs, numReplaced, pathLength );
        if ( fabs(probabF-probabS) > 1.0e-6 ) printf( "WARNING: Probabilities mismatch (%.6f %.6f).\n", probabF, probabS );
        #endif
        if ( probabF > maxProbab ) maxProbab = probabF;
    }
    return maxProbab;
}